

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtok.c
# Opt level: O3

char * strtok(char *__s,char *__delim)

{
  char *pcVar1;
  
  if (__s != (char *)0x0) {
    strtok::tmp = __s;
    strtok::max = strlen(__s);
  }
  pcVar1 = _PDCLIB_strtok(__s,&strtok::max,__delim,&strtok::tmp);
  return pcVar1;
}

Assistant:

char * strtok( char * _PDCLIB_restrict s1, const char * _PDCLIB_restrict s2 )
{
    static char * tmp = NULL;
    static rsize_t max;

    if ( s1 != NULL )
    {
        /* new string */
        tmp = s1;
        max = strlen( tmp );
    }

    return _PDCLIB_strtok( s1, &max, s2, &tmp );
}